

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::AddMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  MessageLite *pMVar5;
  MapFieldBase *this_00;
  Descriptor *pDVar6;
  long *plVar7;
  Type *value;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  undefined4 extraout_var;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_40);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    pMVar5 = internal::ExtensionSet::AddMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),field,factory);
    return (Message *)pMVar5;
  }
  bVar2 = anon_unknown_0::IsMapFieldInApi(field);
  uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  if (bVar2) {
    this_00 = (MapFieldBase *)internal::MapFieldBase::MutableRepeatedField(this_00);
  }
  pRVar1 = this_00->repeated_field_;
  if (pRVar1 != (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    iVar4 = *(int *)&this_00->arena_;
    if (iVar4 < *(int *)&(pRVar1->super_RepeatedPtrFieldBase).arena_) {
      *(int *)&this_00->arena_ = iVar4 + 1;
      value = *(Type **)(&(pRVar1->super_RepeatedPtrFieldBase).current_size_ + (long)iVar4 * 2);
      goto LAB_0028959b;
    }
  }
  value = (Type *)0x0;
LAB_0028959b:
  if (value == (Type *)0x0) {
    if (*(int *)&this_00->arena_ == 0) {
      pDVar6 = FieldDescriptor::message_type(field);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
      plVar7 = (long *)CONCAT44(extraout_var,iVar4);
    }
    else {
      plVar7 = *(long **)&(pRVar1->super_RepeatedPtrFieldBase).current_size_;
    }
    iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    value = (Type *)(**(code **)(*plVar7 + 0x20))(plVar7,iVar4);
    internal::RepeatedPtrFieldBase::
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)this_00,value);
  }
  return value;
}

Assistant:

Message* Reflection::AddMessage(Message* message, const FieldDescriptor* field,
                                MessageFactory* factory) const {
  USAGE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = nullptr;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == nullptr) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}